

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O2

void plot_robot(int n)

{
  long lVar1;
  long lVar2;
  int y;
  int x;
  
  lVar2 = 0x39;
  if (f_width == '\0') {
    lVar2 = 0;
  }
  lVar1 = 0x16;
  if (f_height == '\0') {
    lVar1 = 0;
  }
  x = (int)((lVar2 * ((robots[n].x + 5) / 10)) / 1000) + 2;
  y = (int)lVar1 + (int)((lVar1 * ((robots[n].y + 5) / 10)) / -1000) + 2;
  if ((robots[n].last_x != x) || (robots[n].last_y != y)) {
    for (lVar2 = 0; lVar2 != 0x2e0; lVar2 = lVar2 + 0xb8) {
      if (((((ulong)(uint)n * 0xb8 - lVar2 != 0) && (robots[n].status != 0)) &&
          (x == *(int *)(robots[0].name + lVar2 + 0x24))) &&
         (y == *(int *)(robots[0].name + lVar2 + 0x28))) {
        return;
      }
    }
    if (-1 < robots[n].last_y) {
      move(robots[n].last_y,robots[n].last_x);
      putchar(0x20);
    }
    move(y,x);
    putchar(n + 0x31);
    robots[n].last_x = x;
    robots[n].last_y = y;
  }
  return;
}

Assistant:

void plot_robot(int n)
{
  int i, k;
   int new_x, new_y;

  new_x = (int) (((long)((robots[n].x+(CLICK/2)) / CLICK) * f_width) / MAX_X);
  new_y = (int) (((long)((robots[n].y+(CLICK/2)) / CLICK) * f_height) / MAX_Y);
  /* add one to x and y for playfield offset in screen, and inverse y */
  new_x += 2;;
  new_y = f_height - new_y;
  new_y +=2;

  if (robots[n].last_x != new_x || robots[n].last_y != new_y) {
    /* check for conflict */
    k = 1;
    for (i = 0; i < MAXROBOTS; i++) {
      if (i == n || robots[n].status == DEAD)
	continue; /* same robot as n or inactive */
      if (new_x == robots[i].last_x && new_y == robots[i].last_y) {
	k = 0;
	break;	  /* conflict, robot in that position */
      }
    }
    if (k) {
      if (robots[n].last_y >= 0) {
	move(robots[n].last_y,robots[n].last_x);
	addch(' ');
      }
      move(new_y,new_x);
      addch(n+'1');  /* ASCII dependent */
      refresh();
      robots[n].last_x = new_x;
      robots[n].last_y = new_y;
    }
  }
}